

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::SaveTo(Builder *this,Version *v)

{
  set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  InternalKeyComparator *__comp;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_01;
  size_type sVar3;
  size_type sVar4;
  reference ppFVar5;
  ulong uVar6;
  reference ppFVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  string local_e0;
  string local_c0;
  InternalKey *local_a0;
  InternalKey *this_begin;
  InternalKey *prev_end;
  InternalKeyComparator *pIStack_88;
  uint32_t i;
  FileSet *local_80;
  FileMetaData **local_78;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_70;
  const_iterator bpos;
  FileMetaData **added_file;
  iterator __end3;
  iterator __begin3;
  FileSet *__range3;
  FileSet *added_files;
  const_iterator base_end;
  const_iterator base_iter;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *base_files;
  int level;
  BySmallestKey cmp;
  Version *v_local;
  Builder *this_local;
  
  __comp = &this->vset_->icmp_;
  base_files._4_4_ = 0;
  do {
    if (6 < base_files._4_4_) {
      return;
    }
    this_01 = this->base_->files_ + base_files._4_4_;
    base_end = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::begin
                         (this_01);
    added_files = (FileSet *)
                  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  end(this_01);
    this_00 = this->levels_[base_files._4_4_].added_files;
    sVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (this_01);
    sVar4 = std::
            set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
            ::size(this_00);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              (v->files_ + base_files._4_4_,sVar3 + sVar4);
    __end3 = std::
             set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
             ::begin(this_00);
    added_file = (FileMetaData **)
                 std::
                 set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
                 ::end(this_00);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&added_file), bVar1) {
      bpos._M_current = std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator*(&__end3);
      local_78 = base_end._M_current;
      local_80 = added_files;
      pIStack_88 = __comp;
      local_70 = std::
                 upper_bound<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,leveldb::FileMetaData*,leveldb::VersionSet::Builder::BySmallestKey>
                           (base_end._M_current,
                            (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                             )added_files,bpos._M_current,(BySmallestKey)__comp);
      while (bVar1 = __gnu_cxx::operator!=(&base_end,&local_70), bVar1) {
        ppFVar5 = __gnu_cxx::
                  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                  ::operator*(&base_end);
        MaybeAddFile(this,v,base_files._4_4_,*ppFVar5);
        __gnu_cxx::
        __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
        ::operator++(&base_end);
      }
      MaybeAddFile(this,v,base_files._4_4_,*bpos._M_current);
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator++(&__end3);
    }
    while (bVar1 = __gnu_cxx::operator!=
                             (&base_end,
                              (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                               *)&added_files), bVar1) {
      ppFVar5 = __gnu_cxx::
                __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                ::operator*(&base_end);
      MaybeAddFile(this,v,base_files._4_4_,*ppFVar5);
      __gnu_cxx::
      __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
      ::operator++(&base_end);
    }
    if (0 < base_files._4_4_) {
      for (prev_end._4_4_ = 1; uVar6 = (ulong)prev_end._4_4_,
          sVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size(v->files_ + base_files._4_4_), uVar6 < sVar3;
          prev_end._4_4_ = prev_end._4_4_ + 1) {
        ppFVar7 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[](v->files_ + base_files._4_4_,(ulong)(prev_end._4_4_ - 1));
        this_begin = &(*ppFVar7)->largest;
        ppFVar7 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[](v->files_ + base_files._4_4_,(ulong)prev_end._4_4_);
        local_a0 = &(*ppFVar7)->smallest;
        iVar2 = InternalKeyComparator::Compare(&this->vset_->icmp_,this_begin,local_a0);
        __stream = _stderr;
        if (-1 < iVar2) {
          InternalKey::DebugString_abi_cxx11_(&local_c0,this_begin);
          uVar8 = std::__cxx11::string::c_str();
          InternalKey::DebugString_abi_cxx11_(&local_e0,local_a0);
          uVar9 = std::__cxx11::string::c_str();
          fprintf(__stream,"overlapping ranges in same level %s vs. %s\n",uVar8,uVar9);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_c0);
          abort();
        }
      }
    }
    base_files._4_4_ = base_files._4_4_ + 1;
  } while( true );
}

Assistant:

void SaveTo(Version* v) {
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      // Merge the set of added files with the set of pre-existing files.
      // Drop any deleted files.  Store the result in *v.
      const std::vector<FileMetaData*>& base_files = base_->files_[level];
      std::vector<FileMetaData*>::const_iterator base_iter = base_files.begin();
      std::vector<FileMetaData*>::const_iterator base_end = base_files.end();
      const FileSet* added_files = levels_[level].added_files;
      v->files_[level].reserve(base_files.size() + added_files->size());
      for (const auto& added_file : *added_files) {
        // Add all smaller files listed in base_
        for (std::vector<FileMetaData*>::const_iterator bpos =
                 std::upper_bound(base_iter, base_end, added_file, cmp);
             base_iter != bpos; ++base_iter) {
          MaybeAddFile(v, level, *base_iter);
        }

        MaybeAddFile(v, level, added_file);
      }

      // Add remaining base files
      for (; base_iter != base_end; ++base_iter) {
        MaybeAddFile(v, level, *base_iter);
      }

#ifndef NDEBUG
      // Make sure there is no overlap in levels > 0
      if (level > 0) {
        for (uint32_t i = 1; i < v->files_[level].size(); i++) {
          const InternalKey& prev_end = v->files_[level][i - 1]->largest;
          const InternalKey& this_begin = v->files_[level][i]->smallest;
          if (vset_->icmp_.Compare(prev_end, this_begin) >= 0) {
            std::fprintf(stderr, "overlapping ranges in same level %s vs. %s\n",
                         prev_end.DebugString().c_str(),
                         this_begin.DebugString().c_str());
            std::abort();
          }
        }
      }
#endif
    }
  }